

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O1

int __thiscall Class::getVariableOffset(Class *this)

{
  pointer piVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar1 = (this->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  iVar2 = 0;
  if ((lVar3 != 4) && (uVar4 = lVar3 >> 2, iVar2 = 0, uVar4 != 1)) {
    iVar2 = 0;
    uVar5 = 1;
    do {
      if (uVar4 < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      iVar2 = iVar2 + piVar1[uVar5 - 1];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return iVar2;
}

Assistant:

int Class::getVariableOffset() const {
    if (sizes.size() == 1) return 0;
    int toReturn = 0;
    for (int i = 0; i < sizes.size() - 1; i++) toReturn += sizes.at(i);
    return toReturn;
}